

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

stb_vorbis *
stb_vorbis_open_file_section
          (FAudioIOStream *file,int close_on_free,int *error,stb_vorbis_alloc *alloc,uint length)

{
  int iVar1;
  undefined4 *in_RDX;
  undefined8 *in_RDI;
  stb_vorbis p;
  stb_vorbis *f;
  stb_vorbis_alloc *in_stack_fffffffffffff8a8;
  stb_vorbis *in_stack_fffffffffffff8b0;
  stb_vorbis *in_stack_fffffffffffff8d0;
  undefined4 local_6bc;
  vorb *in_stack_fffffffffffffe38;
  stb_vorbis *local_8;
  
  vorbis_init(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  (*(code *)in_RDI[2])(*in_RDI,0,1);
  iVar1 = start_decoder(in_stack_fffffffffffffe38);
  if ((iVar1 == 0) ||
     (local_8 = vorbis_alloc(in_stack_fffffffffffff8b0), local_8 == (stb_vorbis *)0x0)) {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = local_6bc;
    }
    vorbis_deinit(in_stack_fffffffffffff8d0);
    local_8 = (stb_vorbis *)0x0;
  }
  else {
    memcpy(local_8,&stack0xfffffffffffff8a8,0x720);
    vorbis_pump_first_frame(in_stack_fffffffffffff8b0);
  }
  return local_8;
}

Assistant:

stb_vorbis * stb_vorbis_open_file_section(FILE *file, int close_on_free, int *error, const stb_vorbis_alloc *alloc, unsigned int length)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.f = file;
   p.f_start = (uint32) ftell(file);
   p.stream_len   = length;
   p.close_on_free = close_on_free;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}